

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O3

void __thiscall OpenMD::Mie::calcForce(Mie *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  pointer piVar6;
  uint i;
  long lVar7;
  long lVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double __y;
  double dVar14;
  double dVar15;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  double local_58 [4];
  double local_38 [4];
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar6 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)piVar6[idat->atid2];
  lVar7 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar6[idat->atid1]].
                    super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  dVar1 = *(double *)(lVar7 + 8 + lVar8 * 0x28);
  dVar2 = *(double *)(lVar7 + 0x10 + lVar8 * 0x28);
  iVar5 = *(int *)(lVar7 + 0x18 + lVar8 * 0x28);
  dVar3 = *(double *)(lVar7 + 0x20 + lVar8 * 0x28);
  __x = 1.0 / (idat->rij * dVar2);
  dVar12 = (double)iVar5;
  __y = (double)*(int *)(lVar7 + 0x1c + lVar8 * 0x28);
  dVar9 = pow(__x,dVar12);
  dVar10 = pow(__x,__y);
  dVar14 = (double)-iVar5;
  if (idat->shiftedPot == true) {
    dVar13 = 1.0 / (idat->rcut * dVar2);
    dVar11 = pow(dVar13,dVar12);
    dVar12 = pow(dVar13,__y);
    dVar11 = dVar11 - dVar12;
    dVar13 = 0.0;
  }
  else {
    dVar11 = 0.0;
    dVar13 = 0.0;
    if (idat->shiftedForce == true) {
      dVar13 = 1.0 / (idat->rcut * dVar2);
      dVar12 = pow(dVar13,dVar12);
      dVar11 = pow(dVar13,__y);
      dVar13 = dVar14 * dVar12 * dVar13 + dVar13 * dVar11 * __y;
      dVar11 = (idat->rij - idat->rcut) * dVar13 * dVar2 + (dVar12 - dVar11);
    }
  }
  dVar12 = idat->sw;
  dVar4 = idat->vdwMult;
  dVar15 = dVar3 * dVar4 * dVar1 * ((dVar9 - dVar10) - dVar11);
  dVar11 = dVar12 * dVar15;
  idat->vpair = dVar15 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar11;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar11 + (idat->selePot).data_[1];
  }
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  lVar7 = 0;
  do {
    local_58[lVar7] =
         (idat->d).super_Vector<double,_3U>.data_[lVar7] *
         dVar2 * ((dVar9 * __x * dVar14 + __x * dVar10 * __y) - dVar13) *
                 dVar1 * dVar3 * dVar4 * dVar12;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar1 = idat->rij;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  lVar7 = 0;
  do {
    local_38[lVar7] = local_58[lVar7] / dVar1;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar7] =
         local_38[lVar7] + (idat->f1).super_Vector<double,_3U>.data_[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return;
}

Assistant:

void Mie::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MieInteractionData& mixer =
        MixingMap[MieTids[idat.atid1]][MieTids[idat.atid2]];
    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;
    int nRep         = mixer.nRep;
    int mAtt         = mixer.mAtt;
    RealType nmScale = mixer.nmScale;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getMieFunc(ros, nRep, mAtt, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getMieFunc(rcos, nRep, mAtt, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getMieFunc(rcos, nRep, mAtt, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * nmScale * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * nmScale * epsilon *
                    (myDeriv - myDerivC) * sigmai;

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }